

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O2

int AF_A_GetHurt(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *ent;
  char *__assertion;
  undefined8 uStack_28;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00552932;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    uStack_28 = in_RAX;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0055280f:
        ent = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00552932;
        }
      }
      if (numparam == 1) goto LAB_0055288f;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_00552922;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00552932;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00552922;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0055288f:
        pbVar1 = (byte *)((long)&(ent->flags4).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
        iVar4 = FRandom::operator()(&pr_gethurt);
        if (iVar4 % 5 == 0) {
          uStack_28 = CONCAT44((ent->PainSound).super_FSoundID.ID,(undefined4)uStack_28);
          S_Sound(ent,2,(FSoundID *)((long)&uStack_28 + 4),1.0,1.0);
          iVar4 = ent->health + -1;
          ent->health = iVar4;
        }
        else {
          iVar4 = ent->health;
        }
        if (iVar4 < 1) {
          pAVar5 = GC::ReadBarrier<AActor>((AActor **)&ent->target);
          pAVar6 = GC::ReadBarrier<AActor>((AActor **)&ent->target);
          (*(ent->super_DThinker).super_DObject._vptr_DObject[0xf])(ent,pAVar5,pAVar6,0);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00552932;
    }
    if (ent == (AActor *)0x0) goto LAB_0055280f;
  }
LAB_00552922:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00552932:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x6f,"int AF_A_GetHurt(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GetHurt)
{
	PARAM_ACTION_PROLOGUE;

	self->flags4 |= MF4_INCOMBAT;
	if ((pr_gethurt() % 5) == 0)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
		self->health--;
	}
	if (self->health <= 0)
	{
		self->Die (self->target, self->target);
	}
	return 0;
}